

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Minisat::Solver::litRedundant(Solver *this,Lit p,uint32_t abstract_levels)

{
  uint64_t *puVar1;
  uint *puVar2;
  char *pcVar3;
  VarData *pVVar4;
  ulong uVar5;
  Lit tmp;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Lit p_1;
  Lit local_58;
  int local_54;
  uint32_t local_50;
  Lit local_4c;
  vec<Minisat::Lit> *local_48;
  ulong local_40;
  vec<Minisat::Lit> *local_38;
  
  local_48 = &this->analyze_stack;
  if ((this->analyze_stack).data != (Lit *)0x0) {
    (this->analyze_stack).sz = 0;
  }
  local_50 = abstract_levels;
  local_4c.x = p.x;
  vec<Minisat::Lit>::push(local_48,&local_4c);
  uVar7 = (this->analyze_stack).sz;
  if (0 < (int)uVar7) {
    local_38 = &this->analyze_toclear;
    local_54 = (this->analyze_toclear).sz;
    lVar10 = (long)local_54;
    local_40 = 0x800000000;
    do {
      puVar2 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      uVar8 = (ulong)(this->vardata).data[(this->analyze_stack).data[(ulong)uVar7 - 1].x >> 1].
                     reason;
      (this->analyze_stack).sz = uVar7 - 1;
      uVar5 = *(ulong *)(puVar2 + uVar8);
      if ((uVar5 & 0xfffffffc00000000) == local_40) {
        uVar7 = puVar2[uVar8 + 2];
        if (((byte)uVar7 & 1 ^ (this->assigns).data[(int)uVar7 >> 1].value) == 1) {
          puVar2[uVar8 + 2] = puVar2[uVar8 + 3];
          puVar2[uVar8 + 3] = uVar7;
        }
LAB_00115fe1:
        uVar9 = 1;
        do {
          local_58.x = puVar2[uVar8 + uVar9 + 2];
          iVar6 = local_58.x >> 1;
          pcVar3 = (this->seen).data;
          if (pcVar3[iVar6] == '\0') {
            pVVar4 = (this->vardata).data;
            uVar7 = pVVar4[iVar6].level;
            if (0 < (int)uVar7) {
              if ((pVVar4[iVar6].reason == 0xffffffff) || ((local_50 >> (uVar7 & 0x1f) & 1) == 0)) {
                iVar6 = (this->analyze_toclear).sz;
                if (local_54 < iVar6) {
                  do {
                    (this->seen).data[(this->analyze_toclear).data[lVar10].x >> 1] = '\0';
                    lVar10 = lVar10 + 1;
                    iVar6 = (this->analyze_toclear).sz;
                  } while (lVar10 < iVar6);
                }
                if (local_54 < iVar6) {
                  (this->analyze_toclear).sz = local_54;
                }
                return false;
              }
              pcVar3[iVar6] = '\x01';
              vec<Minisat::Lit>::push(local_48,&local_58);
              vec<Minisat::Lit>::push(local_38,&local_58);
              puVar1 = &(this->statistics).solveSteps;
              *puVar1 = *puVar1 + 1;
              uVar5 = *(ulong *)(puVar2 + uVar8);
            }
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar5 >> 0x22);
      }
      else if (0x7ffffffff < uVar5) goto LAB_00115fe1;
      uVar7 = (this->analyze_stack).sz;
    } while (0 < (int)uVar7);
  }
  return true;
}

Assistant:

bool Solver::litRedundant(Lit p, uint32_t abstract_levels)
{
    analyze_stack.clear();
    analyze_stack.push(p);
    int top = analyze_toclear.size();
    while (analyze_stack.size() > 0) {
        assert(reason(var(analyze_stack.last())) != CRef_Undef);
        Clause &c = ca[reason(var(analyze_stack.last()))];
        analyze_stack.pop();

        // Special handling for binary clauses like in 'analyze()'.
        if (c.size() == 2 && value(c[0]) == l_False) {
            assert(value(c[1]) == l_True);
            Lit tmp = c[0];
            c[0] = c[1], c[1] = tmp;
        }

        for (int i = 1; i < c.size(); i++) {
            Lit p = c[i];
            if (!seen[var(p)] && level(var(p)) > 0) {
                if (reason(var(p)) != CRef_Undef && (abstractLevel(var(p)) & abstract_levels) != 0) {
                    seen[var(p)] = 1;
                    analyze_stack.push(p);
                    analyze_toclear.push(p);
                    statistics.solveSteps++;
                } else {
                    for (int j = top; j < analyze_toclear.size(); j++) seen[var(analyze_toclear[j])] = 0;
                    analyze_toclear.shrink(analyze_toclear.size() - top);
                    return false;
                }
            }
        }
    }

    return true;
}